

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,void *ptr)

{
  allocator<char> local_39;
  char buffer [32];
  
  snprintf(buffer,0x20,"%p",this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(const void *ptr) {
  char buffer[32];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%p", ptr);
#else
  snprintf(buffer, sizeof(buffer), "%p", ptr);
#endif
  return buffer;
}